

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O1

void __thiscall CMU462::StaticScene::BVHAccel::~BVHAccel(BVHAccel *this)

{
  pointer ppPVar1;
  
  (this->super_Aggregate).super_Primitive._vptr_Primitive = (_func_int **)&PTR_get_bbox_00271e38;
  delete_tree(this,this->root);
  puts("BVH deleted!");
  (this->super_Aggregate).super_Primitive._vptr_Primitive =
       (_func_int **)&PTR___cxa_pure_virtual_00271ea8;
  ppPVar1 = (this->super_Aggregate).primitives.
            super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar1 != (pointer)0x0) {
    operator_delete(ppPVar1);
    return;
  }
  return;
}

Assistant:

BVHAccel::~BVHAccel() {
		// TODO (PathTracer):
		// Implement a proper destructor for your BVH accelerator aggregate
		delete_tree(root);
		printf("BVH deleted!\n");
	}